

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_alloc.c
# Opt level: O2

void small_alloc_test(int size_min,int size_max,int objects_max,int oscillation_max,
                     int iterations_max)

{
  uint __line;
  int iVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  undefined8 uStackY_80;
  char *pcVar8;
  undefined1 local_68 [8];
  small_stats totals;
  ulong uStack_50;
  float actual_alloc_factor;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  local_48 = objects_max;
  local_34 = oscillation_max;
  small_alloc_create(&alloc,&cache,0xc,8,1.3,(float *)((long)&totals.total + 4));
  local_40 = size_max - size_min;
  iVar1 = 0;
  local_44 = size_max;
  local_38 = iterations_max;
  if (iterations_max < 1) {
    local_38 = 0;
  }
  do {
    if (iVar1 == local_38) {
      for (lVar7 = 0; lVar7 != 8000; lVar7 = lVar7 + 8) {
        if (*(int **)((long)ptrs + lVar7) != (int *)0x0) {
          free_checked(*(int **)((long)ptrs + lVar7));
        }
      }
      uStack_50 = 0;
      small_stats(&alloc,(small_stats *)local_68,small_is_unused_cb,&stack0xffffffffffffffb0);
      if (local_68 == (undefined1  [8])0x0) {
        if (cache.allocated.stats.used <= uStack_50) {
          small_alloc_destroy(&alloc);
          return;
        }
        pcVar8 = "small_check_unused";
        pcVar5 = "slab_cache_used(&cache) > slab_total";
        pcVar4 = "true";
        uStackY_80 = 0x4f;
      }
      else {
        pcVar8 = "small_check_unused";
        pcVar5 = "totals.used > 0";
        pcVar4 = "true";
        uStackY_80 = 0x4e;
      }
LAB_00102a3a:
      fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",pcVar5,pcVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_alloc.c"
              ,uStackY_80,pcVar8);
      exit(-1);
    }
    local_3c = iVar1;
    iVar1 = rand();
    uVar6 = (long)iVar1 % (long)local_34 & 0xffffffff;
    if ((int)((long)iVar1 % (long)local_34) < 1) {
      uVar6 = 0;
    }
    while (iVar1 = (int)uVar6, uVar6 = (ulong)(iVar1 - 1), iVar1 != 0) {
      iVar1 = rand();
      iVar1 = iVar1 % local_48;
      if (local_44 <= size_min) {
        pcVar4 = "size_max > size_min";
        __line = 0x28;
LAB_00102a01:
        __assert_fail(pcVar4,
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_alloc.c"
                      ,__line,"void *alloc_checked(int, int, int)");
      }
      iVar2 = rand();
      iVar2 = iVar2 % local_40;
      piVar3 = ptrs[iVar1];
      if (piVar3 != (int *)0x0) {
        if (*piVar3 != iVar1) {
          pcVar4 = "ptrs[pos][0] == pos";
          __line = 0x2c;
          goto LAB_00102a01;
        }
        free_checked(piVar3);
      }
      if (allocating == true) {
        iVar2 = iVar2 + size_min;
        piVar3 = (int *)smalloc(&alloc,(long)iVar2);
        if (piVar3 == (int *)0x0) {
          pcVar8 = "alloc_checked";
          pcVar5 = "ptr != NULL";
          pcVar4 = "false";
          uStackY_80 = 0x32;
          goto LAB_00102a3a;
        }
        ptrs[iVar1] = piVar3;
        *piVar3 = iVar1;
        piVar3[1] = iVar2;
        *(int *)((long)piVar3 + (((long)iVar2 & 0xfffffffffffffffcU) - 4)) = iVar1;
      }
    }
    allocating = (_Bool)(allocating ^ 1);
    iVar1 = local_3c + 1;
  } while( true );
}

Assistant:

static void
small_alloc_test(int size_min, int size_max, int objects_max,
		 int oscillation_max, int iterations_max)
{
	float actual_alloc_factor;
	small_alloc_create(&alloc, &cache, OBJSIZE_MIN,
			   sizeof(intptr_t), 1.3,
			   &actual_alloc_factor);

	for (int i = 0; i < iterations_max; i++) {
		int oscillation = rand() % oscillation_max;
		for (int j = 0; j < oscillation; ++j) {
			int pos = rand() % objects_max;
			alloc_checked(pos, size_min, size_max);
		}
		allocating = ! allocating;
	}

	for (int pos = 0; pos < OBJECTS_MAX; pos++) {
		if (ptrs[pos] != NULL)
			free_checked(ptrs[pos]);
	}

	small_check_unused();

	small_alloc_destroy(&alloc);
}